

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O1

ErrorStackOption *
ritobin::io::json_impl::json_value_impl<ritobin::Vec2,_(ritobin::Category)2>::from_json
          (ErrorStackOption *__return_storage_ptr__,Vec2 *value,json *json)

{
  bool bVar1;
  char *pcVar2;
  reference j;
  float ret;
  const_iterator __begin3;
  const_iterator __end3;
  float local_7c;
  const_iterator local_78;
  undefined8 local_57;
  undefined4 local_4f;
  undefined2 local_4b;
  undefined1 local_49;
  const_iterator local_48;
  
  if (json->m_type == array) {
    if ((ulong)((long)(((json->m_value).array)->
                      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(((json->m_value).array)->
                     super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::cbegin(&local_78,json);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::cend(&local_48,json);
      while (bVar1 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator==(&local_78,&local_48), !bVar1) {
        j = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator*(&local_78);
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_float,_0>
                  (j,&local_7c);
        *(float *)value = local_7c;
        value = (Vec2 *)((long)value + 4);
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++(&local_78);
      }
      (__return_storage_ptr__->
      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
      super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = false;
      return __return_storage_ptr__;
    }
    pcVar2 = "json.size() <= value.value.size()";
  }
  else {
    pcVar2 = "json.is_array()";
  }
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type = "vec2"
  ;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.message =
       pcVar2;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
  _M_dataplus._M_p =
       (pointer)((long)&(__return_storage_ptr__->
                        super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                        _M_payload.
                        super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                        .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload
                + 0x20);
  *(undefined1 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x20) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path
           .field_2 + 1) = local_57;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x29) =
       local_4f;
  *(undefined2 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x2d) =
       local_4b;
  *(undefined1 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x2f) =
       local_49;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
  _M_string_length = 0;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            bin_json_assert(json.is_array());
            bin_json_assert(json.size() <= value.value.size());
            size_t i = 0;
            for (auto const& item: json) {
                value.value[i++] = item;
            }
            return std::nullopt;
        }